

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O3

InfoStatus
getLocalInfoValue(HighsLogOptions *report_log_options,string *name,bool valid,
                 vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,double *value)

{
  InfoRecord *pIVar1;
  pointer pcVar2;
  InfoStatus IVar3;
  InfoStatus IVar4;
  HighsInt index;
  InfoRecordDouble info;
  int local_94;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  char local_70 [16];
  _Alloc_hider local_60;
  char local_50 [16];
  bool local_40;
  _func_int **local_38;
  undefined8 uStack_30;
  
  IVar3 = getInfoIndex(report_log_options,name,info_records,&local_94);
  IVar4 = kUnavailable;
  if (IVar3 != kOk) {
    IVar4 = IVar3;
  }
  if (IVar3 == kOk && valid) {
    pIVar1 = (info_records->super__Vector_base<InfoRecord_*,_std::allocator<InfoRecord_*>_>)._M_impl
             .super__Vector_impl_data._M_start[local_94];
    if (pIVar1->type == kDouble) {
      local_90._0_8_ = &PTR__InfoRecord_00440d78;
      local_90._8_4_ = kDouble;
      local_80._M_allocated_capacity = (size_type)local_70;
      pcVar2 = (pIVar1->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_90 + 0x10),pcVar2,pcVar2 + (pIVar1->name)._M_string_length);
      local_60._M_p = local_50;
      pcVar2 = (pIVar1->description)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar2,pcVar2 + (pIVar1->description)._M_string_length);
      local_40 = pIVar1->advanced;
      local_90._0_8_ = &PTR__InfoRecord_00440d98;
      local_38 = pIVar1[1]._vptr_InfoRecord;
      uStack_30 = *(undefined8 *)&pIVar1[1].type;
      *value = (double)*local_38;
      InfoRecord::~InfoRecord((InfoRecord *)local_90);
      IVar4 = kOk;
    }
    else {
      pcVar2 = (name->_M_dataplus)._M_p;
      infoEntryTypeToString_abi_cxx11_((string *)local_90,pIVar1->type);
      highsLogUser(report_log_options,kError,
                   "getInfoValue: Info \"%s\" requires value of type %s, not double\n",pcVar2,
                   local_90._0_8_);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_);
      }
      IVar4 = kIllegalValue;
    }
  }
  return IVar4;
}

Assistant:

InfoStatus getLocalInfoValue(const HighsLogOptions& report_log_options,
                             const std::string& name, const bool valid,
                             const std::vector<InfoRecord*>& info_records,
                             double& value) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  if (!valid) return InfoStatus::kUnavailable;
  HighsInfoType type = info_records[index]->type;
  if (type != HighsInfoType::kDouble) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "getInfoValue: Info \"%s\" requires value of type %s, not double\n",
        name.c_str(), infoEntryTypeToString(type).c_str());
    return InfoStatus::kIllegalValue;
  }
  InfoRecordDouble info = ((InfoRecordDouble*)info_records[index])[0];
  value = *info.value;
  return InfoStatus::kOk;
}